

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

size_t DiagnosticInfo_calcSizeBinary(UA_DiagnosticInfo *src,UA_DataType *_)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = 0;
  while( true ) {
    bVar1 = *(byte *)src;
    lVar3 = (ulong)(bVar1 >> 1 & 4) +
            (ulong)(bVar1 & 4) + (ulong)(bVar1 & 1) * 4 + (ulong)(bVar1 & 2) * 2 + 1;
    if ((bVar1 & 0x10) != 0) {
      lVar3 = lVar3 + (src->additionalInfo).length + 4;
    }
    lVar3 = (ulong)(bVar1 >> 3 & 4) + lVar3;
    if ((bVar1 & 0x40) == 0) break;
    src = src->innerDiagnosticInfo;
    lVar2 = lVar2 + lVar3;
  }
  return lVar3 + lVar2;
}

Assistant:

static size_t
DiagnosticInfo_calcSizeBinary(const UA_DiagnosticInfo *src, UA_DataType *_) {
    size_t s = 1; // encoding byte
    if(src->hasSymbolicId)
        s += 4;
    if(src->hasNamespaceUri)
        s += 4;
    if(src->hasLocalizedText)
        s += 4;
    if(src->hasLocale)
        s += 4;
    if(src->hasAdditionalInfo)
        s += String_calcSizeBinary(&src->additionalInfo, NULL);
    if(src->hasInnerStatusCode)
        s += 4;
    if(src->hasInnerDiagnosticInfo)
        s += DiagnosticInfo_calcSizeBinary(src->innerDiagnosticInfo, NULL);
    return s;
}